

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::InitializeExecutionModeAndLimits
          (FunctionExecutionStateMachine *this,FunctionBody *functionBody)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  short sVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Type TVar8;
  DebuggerMode DVar9;
  uint sourceContextId;
  uint32 uVar10;
  uint32 uVar11;
  uint32 uVar12;
  undefined4 *puVar13;
  ushort uVar14;
  Type TVar15;
  uint16 newFullJitThreshold;
  double dVar16;
  
  if (this->initializedExecutionModeAndLimits == false) {
    DVar9 = FunctionBody::GetDebuggerMode(functionBody);
    this->initDebuggerMode = DVar9;
  }
  this->initializedExecutionModeAndLimits = true;
  pFVar1 = (this->owner).ptr;
  if (pFVar1 != functionBody && pFVar1 != (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x4a,"(owner == nullptr || owner == functionBody)",
                                "owner == nullptr || owner == functionBody");
    if (!bVar5) goto LAB_0078a7e9;
    *puVar13 = 0;
  }
  Memory::Recycler::WBSetBit((char *)this);
  (this->owner).ptr = functionBody;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  bVar5 = FunctionBody::SkipAutoProfileForCoroutine(functionBody);
  this->interpreterLimit = 0;
  TVar8 = 0;
  if (!bVar5) {
    TVar8 = (Type)DAT_015bbe10;
  }
  this->autoProfilingInterpreter0Limit = TVar8;
  TVar8 = (short)DAT_015bbe18 + (short)DAT_015bbe10;
  if (!bVar5) {
    TVar8 = (Type)DAT_015bbe14;
  }
  this->profilingInterpreter0Limit = TVar8;
  TVar8 = 0;
  if (!bVar5) {
    TVar8 = (Type)DAT_015bbe18;
  }
  this->autoProfilingInterpreter1Limit = TVar8;
  this->simpleJitLimit = (Type)DAT_015bbe1c;
  this->profilingInterpreter1Limit = (Type)DAT_015bbe20;
  bVar6 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  if (bVar6) {
    bVar7 = FunctionBody::DoInterpreterAutoProfile((this->owner).ptr);
    if (bVar7) {
      uVar14 = 0;
    }
    else {
      uVar14 = this->autoProfilingInterpreter1Limit + this->autoProfilingInterpreter0Limit;
      this->autoProfilingInterpreter0Limit = 0;
      this->autoProfilingInterpreter1Limit = 0;
      if (DAT_015bbe4c == '\0') {
        this->simpleJitLimit = this->simpleJitLimit + this->profilingInterpreter0Limit;
        this->profilingInterpreter0Limit = 0;
      }
    }
  }
  else {
    uVar14 = this->profilingInterpreter0Limit + this->autoProfilingInterpreter0Limit +
             this->autoProfilingInterpreter1Limit + this->profilingInterpreter1Limit;
    this->autoProfilingInterpreter0Limit = 0;
    this->profilingInterpreter0Limit = 0;
    this->autoProfilingInterpreter1Limit = 0;
    this->profilingInterpreter1Limit = 0;
  }
  bVar7 = FunctionBody::DoSimpleJit((this->owner).ptr);
  if (!bVar7) {
    if ((bVar6) && (DAT_015bbe4c == '\0')) {
      this->profilingInterpreter1Limit = this->profilingInterpreter1Limit + this->simpleJitLimit;
    }
    else {
      uVar14 = this->simpleJitLimit + uVar14;
    }
    this->simpleJitLimit = 0;
  }
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
  pFVar1 = (this->owner).ptr;
  if ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar6) goto LAB_0078a7e9;
    *puVar13 = 0;
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FullJitPhase,sourceContextId,
                            ((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (bVar6) {
    uVar14 = uVar14 + this->profilingInterpreter1Limit;
    this->profilingInterpreter1Limit = 0;
  }
  TVar8 = (short)DAT_015bbe18 + (short)DAT_015bbe10;
  TVar15 = 0;
  if (!bVar5) {
    TVar15 = TVar8;
    TVar8 = (Type)DAT_015bbe14;
  }
  newFullJitThreshold = TVar15 + TVar8 + (Type)DAT_015bbe1c + (Type)DAT_015bbe20;
  if (DAT_015bbe38 == '\0') {
    uVar10 = FunctionBody::GetCountField((this->owner).ptr,ByteCodeInLoopCount);
    uVar11 = FunctionBody::GetCountField((this->owner).ptr,ByteCodeCount);
    uVar4 = DAT_015b8ec8;
    bVar5 = false;
    if (0 < DAT_015b5fa4) {
      uVar12 = FunctionBody::GetCountField((this->owner).ptr,ByteCodeWithoutLDACount);
      bVar5 = uVar12 <= uVar4;
    }
    if ((uVar10 * 100) / (uVar11 + (uVar11 == 0)) < 0x33 || bVar5) {
      uVar10 = FunctionBody::GetCountField((this->owner).ptr,ByteCodeCount);
      uVar11 = FunctionBody::GetCountField((this->owner).ptr,ByteCodeInLoopCount);
      if (bVar5) {
        dVar16 = (double)DAT_015b5fa4 / 10.0;
      }
      else if (uVar10 - uVar11 < 0x32) {
        dVar16 = 1.2;
      }
      else {
        dVar16 = *(double *)(&DAT_010adaa0 + (ulong)(uVar10 - uVar11 < 100) * 8);
      }
      sVar3 = uVar14 - newFullJitThreshold;
      newFullJitThreshold = (uint16)(int)((double)newFullJitThreshold * dVar16);
      uVar14 = sVar3 + newFullJitThreshold;
    }
  }
  if (newFullJitThreshold < uVar14) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0xb2,"(fullJitThresholdConfig >= scale)",
                                "fullJitThresholdConfig >= scale");
    if (!bVar5) {
LAB_0078a7e9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar13 = 0;
  }
  this->fullJitThreshold = newFullJitThreshold - uVar14;
  this->interpretedCount = 0;
  SetDefaultInterpreterExecutionMode(this);
  SetFullJitThreshold(this,newFullJitThreshold,false);
  TryTransitionToNextInterpreterExecutionMode(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::InitializeExecutionModeAndLimits(FunctionBody* functionBody)
    {
#if DBG
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!initializedExecutionModeAndLimits)
        {
            initDebuggerMode = functionBody->GetDebuggerMode();
        }
#endif
        initializedExecutionModeAndLimits = true;        
#endif
        // Assert we're either uninitialized, or being reinitialized on the same FunctionBody
        Assert(owner == nullptr || owner == functionBody);
        owner = functionBody;

        // AutoProfilingInterpreter might decide to not profile on the first run. For generator
        // functions, that means we will miss the profiling information on the first run when we resume
        // back to the function.
        const bool isCoroutine = functionBody->SkipAutoProfileForCoroutine();

        interpreterLimit               = 0;
        autoProfilingInterpreter0Limit = GetDefaultAutoProfilingInterpreter0Limit(isCoroutine);
        profilingInterpreter0Limit     = GetDefaultProfilingInterpreter0Limit(isCoroutine);
        autoProfilingInterpreter1Limit = GetDefaultAutoProfilingInterpreter1Limit(isCoroutine);
        simpleJitLimit                 = GetDefaultSimpleJitLimit(isCoroutine);
        profilingInterpreter1Limit     = GetDefaultProfilingInterpreter1Limit(isCoroutine);

        // Based on which execution modes are disabled, calculate the number of additional iterations that need to be covered by
        // the execution mode that will scale with the full JIT threshold
        uint16 scale = 0;
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        if (!doInterpreterProfile)
        {
            scale +=
                autoProfilingInterpreter0Limit +
                profilingInterpreter0Limit +
                autoProfilingInterpreter1Limit +
                profilingInterpreter1Limit;
            autoProfilingInterpreter0Limit = 0;
            profilingInterpreter0Limit = 0;
            autoProfilingInterpreter1Limit = 0;
            profilingInterpreter1Limit = 0;
        }
        else if (!owner->DoInterpreterAutoProfile())
        {
            scale += autoProfilingInterpreter0Limit + autoProfilingInterpreter1Limit;
            autoProfilingInterpreter0Limit = 0;
            autoProfilingInterpreter1Limit = 0;
            if (!CONFIG_FLAG(NewSimpleJit))
            {
                simpleJitLimit += profilingInterpreter0Limit;
                profilingInterpreter0Limit = 0;
            }
        }
        if (!owner->DoSimpleJit())
        {
            if (!CONFIG_FLAG(NewSimpleJit) && doInterpreterProfile)
            {
                // The old simple JIT is off, but since it does profiling, it will be replaced with the profiling interpreter
                profilingInterpreter1Limit += simpleJitLimit;
            }
            else
            {
                scale += simpleJitLimit;
            }
            simpleJitLimit = 0;
        }
        if (PHASE_OFF(FullJitPhase, owner))
        {
            scale += profilingInterpreter1Limit;
            profilingInterpreter1Limit = 0;
        }

        uint16 fullJitThresholdConfig = GetDefaultFullJitThreshold(isCoroutine);
        if (!Configuration::Global.flags.EnforceExecutionModeLimits)
        {
            /*
            Scale the full JIT threshold based on some heuristics:
            - If the % of code in loops is > 50, scale by 1
            - Byte-code size of code outside loops
            - If the size is < 50, scale by 1.2
            - If the size is < 100, scale by 1.4
            - If the size is >= 100, scale by 1.6
            */
            const uint loopPercentage = owner->GetByteCodeInLoopCount() * 100 / max(1u, owner->GetByteCodeCount());
            const int byteCodeSizeThresholdForInlineCandidate = CONFIG_FLAG(LoopInlineThreshold);
            bool delayFullJITThisFunc =
                (CONFIG_FLAG(DelayFullJITSmallFunc) > 0) && (owner->GetByteCodeWithoutLDACount() <= (uint)byteCodeSizeThresholdForInlineCandidate);

            if (loopPercentage <= 50 || delayFullJITThisFunc)
            {
                const uint straightLineSize = owner->GetByteCodeCount() - owner->GetByteCodeInLoopCount();
                double fullJitDelayMultiplier;
                if (delayFullJITThisFunc)
                {
                    fullJitDelayMultiplier = CONFIG_FLAG(DelayFullJITSmallFunc) / 10.0;
                }
                else if (straightLineSize < 50)
                {
                    fullJitDelayMultiplier = 1.2;
                }
                else if (straightLineSize < 100)
                {
                    fullJitDelayMultiplier = 1.4;
                }
                else
                {
                    fullJitDelayMultiplier = 1.6;
                }

                const uint16 newFullJitThreshold = static_cast<uint16>(fullJitThresholdConfig * fullJitDelayMultiplier);
                scale += newFullJitThreshold - fullJitThresholdConfig;
                fullJitThresholdConfig = newFullJitThreshold;
            }
        }

        Assert(fullJitThresholdConfig >= scale);
        fullJitThreshold = fullJitThresholdConfig - scale;
        SetInterpretedCount(0);
        SetDefaultInterpreterExecutionMode();
        SetFullJitThreshold(fullJitThresholdConfig);
        TryTransitionToNextInterpreterExecutionMode();
    }